

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O3

void lysp_refine_free(lysf_ctx *ctx,lysp_refine *ref)

{
  undefined8 *puVar1;
  lysp_restr *plVar2;
  lysp_qname *plVar3;
  long lVar4;
  ulong uVar5;
  lysp_ext_instance *plVar6;
  lysp_ext_instance *plVar7;
  
  lydict_remove(ctx->ctx,ref->nodeid);
  lydict_remove(ctx->ctx,ref->dsc);
  lydict_remove(ctx->ctx,ref->ref);
  plVar3 = ref->iffeatures;
  if (plVar3 != (lysp_qname *)0x0) {
    uVar5 = 0xffffffffffffffff;
    lVar4 = 0;
    do {
      uVar5 = uVar5 + 1;
      if (*(ulong *)&plVar3[-1].flags <= uVar5) {
        free(&plVar3[-1].flags);
        break;
      }
      puVar1 = (undefined8 *)((long)&plVar3->str + lVar4);
      lVar4 = lVar4 + 0x18;
      lydict_remove(ctx->ctx,(char *)*puVar1);
      plVar3 = ref->iffeatures;
    } while (plVar3 != (lysp_qname *)0x0);
  }
  plVar2 = ref->musts;
  if (plVar2 != (lysp_restr *)0x0) {
    plVar6 = (lysp_ext_instance *)0xffffffffffffffff;
    lVar4 = 0;
    do {
      plVar6 = (lysp_ext_instance *)((long)&plVar6->name + 1);
      if (plVar2[-1].exts <= plVar6) {
        free(&plVar2[-1].exts);
        break;
      }
      plVar2 = (lysp_restr *)((long)&(plVar2->arg).str + lVar4);
      lVar4 = lVar4 + 0x40;
      lysp_restr_free(ctx,plVar2);
      plVar2 = ref->musts;
    } while (plVar2 != (lysp_restr *)0x0);
  }
  lydict_remove(ctx->ctx,ref->presence);
  plVar3 = ref->dflts;
  if (plVar3 != (lysp_qname *)0x0) {
    uVar5 = 0xffffffffffffffff;
    lVar4 = 0;
    do {
      uVar5 = uVar5 + 1;
      if (*(ulong *)&plVar3[-1].flags <= uVar5) {
        free(&plVar3[-1].flags);
        break;
      }
      puVar1 = (undefined8 *)((long)&plVar3->str + lVar4);
      lVar4 = lVar4 + 0x18;
      lydict_remove(ctx->ctx,(char *)*puVar1);
      plVar3 = ref->dflts;
    } while (plVar3 != (lysp_qname *)0x0);
  }
  plVar6 = ref->exts;
  if (plVar6 != (lysp_ext_instance *)0x0) {
    plVar7 = (lysp_ext_instance *)0xffffffffffffffff;
    lVar4 = 0;
    do {
      plVar7 = (lysp_ext_instance *)((long)&plVar7->name + 1);
      if (plVar6[-1].exts <= plVar7) {
        free(&plVar6[-1].exts);
        return;
      }
      plVar6 = (lysp_ext_instance *)((long)&plVar6->name + lVar4);
      lVar4 = lVar4 + 0x70;
      lysp_ext_instance_free(ctx,plVar6);
      plVar6 = ref->exts;
    } while (plVar6 != (lysp_ext_instance *)0x0);
  }
  return;
}

Assistant:

static void
lysp_refine_free(struct lysf_ctx *ctx, struct lysp_refine *ref)
{
    lydict_remove(ctx->ctx, ref->nodeid);
    lydict_remove(ctx->ctx, ref->dsc);
    lydict_remove(ctx->ctx, ref->ref);
    FREE_ARRAY(ctx->ctx, ref->iffeatures, lysp_qname_free);
    FREE_ARRAY(ctx, ref->musts, lysp_restr_free);
    lydict_remove(ctx->ctx, ref->presence);
    FREE_ARRAY(ctx->ctx, ref->dflts, lysp_qname_free);
    FREE_ARRAY(ctx, ref->exts, lysp_ext_instance_free);
}